

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iunk.c
# Opt level: O3

int envy_bios_parse_iunk21(envy_bios *bios)

{
  byte bVar1;
  ushort uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  byte bVar6;
  long lVar7;
  envy_bios_iunk21_entry *peVar8;
  short sVar9;
  uint uVar10;
  undefined8 uVar11;
  uint uVar12;
  char *__format;
  ulong uVar13;
  int iVar15;
  undefined1 auVar14 [16];
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar34;
  int iVar35;
  int iVar38;
  undefined1 auVar36 [16];
  int iVar39;
  undefined1 auVar37 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar42 [16];
  
  uVar2 = (bios->iunk21).offset;
  iVar35 = 0;
  if (uVar2 != 0) {
    uVar10 = bios->length;
    if (uVar2 < uVar10) {
      (bios->iunk21).version = bios->data[(uint)uVar2];
      iVar15 = 0;
    }
    else {
      (bios->iunk21).version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      uVar2 = (bios->iunk21).offset;
      uVar10 = bios->length;
      iVar15 = -0xe;
    }
    uVar13 = (ulong)uVar2;
    lVar7 = uVar13 + 1;
    if ((uint)lVar7 < uVar10) {
      (bios->iunk21).hlen = bios->data[lVar7];
      iVar39 = 0;
    }
    else {
      (bios->iunk21).hlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n",lVar7);
      uVar13 = (ulong)(bios->iunk21).offset;
      uVar10 = bios->length;
      iVar39 = -0xe;
    }
    uVar12 = (uint)uVar13;
    lVar7 = uVar13 + 2;
    if ((uint)lVar7 < uVar10) {
      (bios->iunk21).rlen = bios->data[lVar7];
      iVar16 = 0;
    }
    else {
      (bios->iunk21).rlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n",lVar7);
      uVar12 = (uint)(bios->iunk21).offset;
      uVar10 = bios->length;
      iVar16 = -0xe;
    }
    if ((uint)((ulong)uVar12 + 3) < uVar10) {
      (bios->iunk21).entriesnum = bios->data[(ulong)uVar12 + 3];
      iVar34 = 0;
    }
    else {
      (bios->iunk21).entriesnum = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar34 = -0xe;
    }
    iVar35 = -0xe;
    if (((iVar39 == 0 && iVar15 == 0) && iVar16 == 0) && iVar34 == 0) {
      envy_bios_block(bios,(uint)(bios->iunk21).offset,
                      (uint)(bios->iunk21).entriesnum * (uint)(bios->iunk21).rlen +
                      (uint)(bios->iunk21).hlen,"IUNK21",-1);
      if ((bios->iunk21).version == '\x10') {
        bVar1 = (bios->iunk21).hlen;
        uVar13 = (ulong)bVar1;
        if (bVar1 < 4) {
          __format = "IUNK21 table header too short [%d < %d]\n";
          uVar11 = 4;
        }
        else {
          bVar6 = (bios->iunk21).rlen;
          if (2 < bVar6) {
            if (bVar1 != 4) {
              fprintf(_stderr,"IUNK21 table header longer than expected [%d > %d]\n",uVar13,4);
              bVar6 = (bios->iunk21).rlen;
            }
            if (3 < bVar6) {
              envy_bios_parse_iunk21_cold_2();
            }
            bVar1 = (bios->iunk21).entriesnum;
            uVar13 = (ulong)bVar1;
            peVar8 = (envy_bios_iunk21_entry *)calloc(uVar13,8);
            (bios->iunk21).entries = peVar8;
            auVar5 = _DAT_00273c40;
            if (peVar8 != (envy_bios_iunk21_entry *)0x0) {
              if (uVar13 != 0) {
                bVar6 = (bios->iunk21).rlen;
                lVar7 = uVar13 - 1;
                auVar14._8_4_ = (int)lVar7;
                auVar14._0_8_ = lVar7;
                auVar14._12_4_ = (int)((ulong)lVar7 >> 0x20);
                sVar9 = (ushort)(bios->iunk21).hlen + (bios->iunk21).offset;
                uVar13 = 0;
                auVar14 = auVar14 ^ _DAT_00273c40;
                auVar17 = _DAT_00273c00;
                auVar18 = _DAT_00273c10;
                auVar19 = _DAT_00273c20;
                auVar20 = _DAT_00273c30;
                do {
                  auVar21 = auVar20 ^ auVar5;
                  iVar35 = auVar14._0_4_;
                  iVar34 = -(uint)(iVar35 < auVar21._0_4_);
                  iVar15 = auVar14._4_4_;
                  auVar22._4_4_ = -(uint)(iVar15 < auVar21._4_4_);
                  iVar39 = auVar14._8_4_;
                  iVar38 = -(uint)(iVar39 < auVar21._8_4_);
                  iVar16 = auVar14._12_4_;
                  auVar22._12_4_ = -(uint)(iVar16 < auVar21._12_4_);
                  auVar31._4_4_ = iVar34;
                  auVar31._0_4_ = iVar34;
                  auVar31._8_4_ = iVar38;
                  auVar31._12_4_ = iVar38;
                  auVar40 = pshuflw(in_XMM11,auVar31,0xe8);
                  auVar24._4_4_ = -(uint)(auVar21._4_4_ == iVar15);
                  auVar24._12_4_ = -(uint)(auVar21._12_4_ == iVar16);
                  auVar24._0_4_ = auVar24._4_4_;
                  auVar24._8_4_ = auVar24._12_4_;
                  auVar42 = pshuflw(in_XMM12,auVar24,0xe8);
                  auVar22._0_4_ = auVar22._4_4_;
                  auVar22._8_4_ = auVar22._12_4_;
                  auVar41 = pshuflw(auVar40,auVar22,0xe8);
                  auVar21._8_4_ = 0xffffffff;
                  auVar21._0_8_ = 0xffffffffffffffff;
                  auVar21._12_4_ = 0xffffffff;
                  auVar21 = (auVar41 | auVar42 & auVar40) ^ auVar21;
                  auVar21 = packssdw(auVar21,auVar21);
                  if ((auVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(short *)((long)&peVar8->offset + uVar13) = sVar9;
                  }
                  auVar22 = auVar24 & auVar31 | auVar22;
                  auVar21 = packssdw(auVar22,auVar22);
                  auVar41._8_4_ = 0xffffffff;
                  auVar41._0_8_ = 0xffffffffffffffff;
                  auVar41._12_4_ = 0xffffffff;
                  auVar21 = packssdw(auVar21 ^ auVar41,auVar21 ^ auVar41);
                  if ((auVar21._0_4_ >> 0x10 & 1) != 0) {
                    *(ushort *)((long)&peVar8[1].offset + uVar13) = (ushort)bVar6 + sVar9;
                  }
                  auVar21 = auVar19 ^ auVar5;
                  iVar34 = -(uint)(iVar35 < auVar21._0_4_);
                  auVar36._4_4_ = -(uint)(iVar15 < auVar21._4_4_);
                  iVar38 = -(uint)(iVar39 < auVar21._8_4_);
                  auVar36._12_4_ = -(uint)(iVar16 < auVar21._12_4_);
                  auVar23._4_4_ = iVar34;
                  auVar23._0_4_ = iVar34;
                  auVar23._8_4_ = iVar38;
                  auVar23._12_4_ = iVar38;
                  auVar30._4_4_ = -(uint)(auVar21._4_4_ == iVar15);
                  auVar30._12_4_ = -(uint)(auVar21._12_4_ == iVar16);
                  auVar30._0_4_ = auVar30._4_4_;
                  auVar30._8_4_ = auVar30._12_4_;
                  auVar36._0_4_ = auVar36._4_4_;
                  auVar36._8_4_ = auVar36._12_4_;
                  auVar21 = auVar30 & auVar23 | auVar36;
                  auVar21 = packssdw(auVar21,auVar21);
                  auVar3._8_4_ = 0xffffffff;
                  auVar3._0_8_ = 0xffffffffffffffff;
                  auVar3._12_4_ = 0xffffffff;
                  auVar21 = packssdw(auVar21 ^ auVar3,auVar21 ^ auVar3);
                  if ((auVar21 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    *(ushort *)((long)&peVar8[2].offset + uVar13) =
                         (ushort)bVar6 + (ushort)bVar6 + sVar9;
                  }
                  auVar24 = pshufhw(auVar23,auVar23,0x84);
                  auVar31 = pshufhw(auVar30,auVar30,0x84);
                  auVar22 = pshufhw(auVar24,auVar36,0x84);
                  auVar25._8_4_ = 0xffffffff;
                  auVar25._0_8_ = 0xffffffffffffffff;
                  auVar25._12_4_ = 0xffffffff;
                  auVar25 = (auVar22 | auVar31 & auVar24) ^ auVar25;
                  auVar24 = packssdw(auVar25,auVar25);
                  if ((auVar24 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    *(ushort *)((long)&peVar8[3].offset + uVar13) =
                         (ushort)bVar6 + (ushort)bVar6 * 2 + sVar9;
                  }
                  auVar24 = auVar18 ^ auVar5;
                  iVar34 = -(uint)(iVar35 < auVar24._0_4_);
                  auVar27._4_4_ = -(uint)(iVar15 < auVar24._4_4_);
                  iVar38 = -(uint)(iVar39 < auVar24._8_4_);
                  auVar27._12_4_ = -(uint)(iVar16 < auVar24._12_4_);
                  auVar32._4_4_ = iVar34;
                  auVar32._0_4_ = iVar34;
                  auVar32._8_4_ = iVar38;
                  auVar32._12_4_ = iVar38;
                  auVar21 = pshuflw(auVar21,auVar32,0xe8);
                  auVar26._4_4_ = -(uint)(auVar24._4_4_ == iVar15);
                  auVar26._12_4_ = -(uint)(auVar24._12_4_ == iVar16);
                  auVar26._0_4_ = auVar26._4_4_;
                  auVar26._8_4_ = auVar26._12_4_;
                  in_XMM12 = pshuflw(auVar42 & auVar40,auVar26,0xe8);
                  in_XMM12 = in_XMM12 & auVar21;
                  auVar27._0_4_ = auVar27._4_4_;
                  auVar27._8_4_ = auVar27._12_4_;
                  auVar21 = pshuflw(auVar21,auVar27,0xe8);
                  auVar40._8_4_ = 0xffffffff;
                  auVar40._0_8_ = 0xffffffffffffffff;
                  auVar40._12_4_ = 0xffffffff;
                  auVar40 = (auVar21 | in_XMM12) ^ auVar40;
                  auVar21 = packssdw(auVar40,auVar40);
                  if ((auVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(ushort *)((long)&peVar8[4].offset + uVar13) = (ushort)bVar6 * 4 + sVar9;
                  }
                  auVar27 = auVar26 & auVar32 | auVar27;
                  auVar21 = packssdw(auVar27,auVar27);
                  auVar42._8_4_ = 0xffffffff;
                  auVar42._0_8_ = 0xffffffffffffffff;
                  auVar42._12_4_ = 0xffffffff;
                  auVar21 = packssdw(auVar21 ^ auVar42,auVar21 ^ auVar42);
                  if ((auVar21 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                    *(ushort *)((long)&peVar8[5].offset + uVar13) =
                         (ushort)bVar6 + (ushort)bVar6 * 4 + sVar9;
                  }
                  auVar21 = auVar17 ^ auVar5;
                  iVar35 = -(uint)(iVar35 < auVar21._0_4_);
                  auVar37._4_4_ = -(uint)(iVar15 < auVar21._4_4_);
                  iVar39 = -(uint)(iVar39 < auVar21._8_4_);
                  auVar37._12_4_ = -(uint)(iVar16 < auVar21._12_4_);
                  auVar28._4_4_ = iVar35;
                  auVar28._0_4_ = iVar35;
                  auVar28._8_4_ = iVar39;
                  auVar28._12_4_ = iVar39;
                  auVar33._4_4_ = -(uint)(auVar21._4_4_ == iVar15);
                  auVar33._12_4_ = -(uint)(auVar21._12_4_ == iVar16);
                  auVar33._0_4_ = auVar33._4_4_;
                  auVar33._8_4_ = auVar33._12_4_;
                  auVar37._0_4_ = auVar37._4_4_;
                  auVar37._8_4_ = auVar37._12_4_;
                  auVar21 = auVar33 & auVar28 | auVar37;
                  auVar21 = packssdw(auVar21,auVar21);
                  auVar4._8_4_ = 0xffffffff;
                  auVar4._0_8_ = 0xffffffffffffffff;
                  auVar4._12_4_ = 0xffffffff;
                  in_XMM11 = packssdw(auVar21 ^ auVar4,auVar21 ^ auVar4);
                  if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    *(ushort *)((long)&peVar8[6].offset + uVar13) =
                         ((ushort)bVar6 + (ushort)bVar6) * 3 + sVar9;
                  }
                  auVar21 = pshufhw(auVar28,auVar28,0x84);
                  auVar22 = pshufhw(auVar33,auVar33,0x84);
                  auVar24 = pshufhw(auVar21,auVar37,0x84);
                  auVar29._8_4_ = 0xffffffff;
                  auVar29._0_8_ = 0xffffffffffffffff;
                  auVar29._12_4_ = 0xffffffff;
                  auVar29 = (auVar24 | auVar22 & auVar21) ^ auVar29;
                  auVar21 = packssdw(auVar29,auVar29);
                  if ((auVar21 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    *(ushort *)((long)&peVar8[7].offset + uVar13) =
                         ((ushort)bVar6 * 8 - (ushort)bVar6) + sVar9;
                  }
                  lVar7 = auVar20._8_8_;
                  auVar20._0_8_ = auVar20._0_8_ + 8;
                  auVar20._8_8_ = lVar7 + 8;
                  lVar7 = auVar19._8_8_;
                  auVar19._0_8_ = auVar19._0_8_ + 8;
                  auVar19._8_8_ = lVar7 + 8;
                  lVar7 = auVar18._8_8_;
                  auVar18._0_8_ = auVar18._0_8_ + 8;
                  auVar18._8_8_ = lVar7 + 8;
                  lVar7 = auVar17._8_8_;
                  auVar17._0_8_ = auVar17._0_8_ + 8;
                  auVar17._8_8_ = lVar7 + 8;
                  sVar9 = sVar9 + (ushort)bVar6 * 8;
                  uVar13 = uVar13 + 0x40;
                } while (((uint)bVar1 * 8 + 0x38 & 0xffffffc0) != uVar13);
              }
              (bios->iunk21).valid = '\x01';
              return 0;
            }
            return -0xc;
          }
          __format = "IUNK21 table record too short [%d < %d]\n";
          uVar13 = (ulong)(uint)bVar6;
          uVar11 = 3;
        }
        fprintf(_stderr,__format,uVar13,uVar11);
      }
      else {
        envy_bios_parse_iunk21_cold_1();
      }
      iVar35 = -0x16;
    }
  }
  return iVar35;
}

Assistant:

int envy_bios_parse_iunk21 (struct envy_bios *bios) {
	struct envy_bios_iunk21 *iunk21 = &bios->iunk21;
	if (!iunk21->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, iunk21->offset, &iunk21->version);
	err |= bios_u8(bios, iunk21->offset+1, &iunk21->hlen);
	err |= bios_u8(bios, iunk21->offset+2, &iunk21->rlen);
	err |= bios_u8(bios, iunk21->offset+3, &iunk21->entriesnum);
	if (err)
		return -EFAULT;
	envy_bios_block(bios, iunk21->offset, iunk21->hlen + iunk21->rlen * iunk21->entriesnum, "IUNK21", -1);
	int wanthlen = 0;
	int wantrlen = 0;
	switch (iunk21->version) {
		case 0x10:
			wanthlen = 4;
			wantrlen = 3;
			break;
		default:
			ENVY_BIOS_ERR("Unknown IUNK21 table version %d.%d\n", iunk21->version >> 4, iunk21->version & 0xf);
			return -EINVAL;
	}
	if (iunk21->hlen < wanthlen) {
		ENVY_BIOS_ERR("IUNK21 table header too short [%d < %d]\n", iunk21->hlen, wanthlen);
		return -EINVAL;
	}
	if (iunk21->rlen < wantrlen) {
		ENVY_BIOS_ERR("IUNK21 table record too short [%d < %d]\n", iunk21->rlen, wantrlen);
		return -EINVAL;
	}
	if (iunk21->hlen > wanthlen) {
		ENVY_BIOS_WARN("IUNK21 table header longer than expected [%d > %d]\n", iunk21->hlen, wanthlen);
	}
	if (iunk21->rlen > wantrlen) {
		ENVY_BIOS_WARN("IUNK21 table record longer than expected [%d > %d]\n", iunk21->rlen, wantrlen);
	}
	iunk21->entries = calloc(iunk21->entriesnum, sizeof *iunk21->entries);
	if (!iunk21->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < iunk21->entriesnum; i++) {
		struct envy_bios_iunk21_entry *entry = &iunk21->entries[i];
		entry->offset = iunk21->offset + iunk21->hlen + iunk21->rlen * i;
		/* XXX */
		if (err)
			return -EFAULT;
	}
	iunk21->valid = 1;
	return 0;
}